

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlparse.c
# Opt level: O2

XML_Error storeAttributeValue(XML_Parser parser,ENCODING *enc,int isCdata,char *ptr,char *end,
                             STRING_POOL *pool)

{
  XML_Error XVar1;
  int iVar2;
  XML_Char *pXVar3;
  
  XVar1 = appendAttributeValue(parser,enc,isCdata,ptr,end,pool);
  if (XVar1 == XML_ERROR_NONE) {
    pXVar3 = pool->ptr;
    if (((isCdata == 0) && (pXVar3 != pool->start)) && (pXVar3[-1] == ' ')) {
      pXVar3 = pXVar3 + -1;
      pool->ptr = pXVar3;
    }
    if (pXVar3 == pool->end) {
      iVar2 = poolGrow(pool);
      if (iVar2 == 0) {
        return XML_ERROR_NO_MEMORY;
      }
      pXVar3 = pool->ptr;
    }
    pool->ptr = pXVar3 + 1;
    *pXVar3 = '\0';
    XVar1 = XML_ERROR_NONE;
  }
  return XVar1;
}

Assistant:

static enum XML_Error
storeAttributeValue(XML_Parser parser, const ENCODING *enc, int isCdata,
                    const char *ptr, const char *end,
                    STRING_POOL *pool)
{
  enum XML_Error result = appendAttributeValue(parser, enc, isCdata, ptr, end, pool);
  if (result)
    return result;
  if (!isCdata && poolLength(pool) && poolLastChar(pool) == 0x20)
    poolChop(pool);
  if (!poolAppendChar(pool, XML_T('\0')))
    return XML_ERROR_NO_MEMORY;
  return XML_ERROR_NONE;
}